

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O3

void ncnn::draw_text_c3(uchar *pixels,int w,int h,int stride,char *text,int x,int y,
                       int fontpixelsize,uint color)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uchar *resized_font_bitmap;
  size_t sVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uchar *puVar15;
  byte *pbVar16;
  
  iVar5 = fontpixelsize * 2;
  resized_font_bitmap = (uchar *)operator_new__((ulong)(uint)(iVar5 * fontpixelsize));
  sVar8 = strlen(text);
  if (0 < (int)(uint)sVar8) {
    uVar11 = 0;
    uVar12 = x;
    do {
      cVar1 = text[uVar11];
      if (cVar1 == ' ') {
        uVar13 = uVar12 + fontpixelsize;
      }
      else if (cVar1 == '\n') {
        y = y + iVar5;
        uVar13 = x;
      }
      else {
        iVar6 = isprint((int)cVar1);
        uVar13 = uVar12;
        if (iVar6 != 0) {
          resize_bilinear_font
                    ((uchar *)((long)cVar1 * 400 + 0x5a74c0),resized_font_bitmap,fontpixelsize);
          uVar7 = 0;
          if (0 < y) {
            uVar7 = y;
          }
          uVar3 = y + iVar5;
          if (h <= y + iVar5) {
            uVar3 = h;
          }
          uVar9 = 0;
          if (0 < (int)uVar12) {
            uVar9 = uVar12;
          }
          uVar13 = uVar12 + fontpixelsize;
          uVar4 = w;
          if ((int)uVar13 < w) {
            uVar4 = uVar13;
          }
          if ((int)uVar7 < (int)uVar3) {
            uVar14 = (ulong)uVar7;
            puVar15 = resized_font_bitmap +
                      (((uVar14 - (long)y) * (long)fontpixelsize + (ulong)uVar9) - (long)(int)uVar12
                      );
            do {
              if ((int)uVar9 < (int)uVar4) {
                pbVar16 = pixels + uVar14 * (long)stride + (ulong)(uVar9 * 3);
                lVar10 = 0;
                do {
                  bVar2 = puVar15[lVar10];
                  uVar12 = bVar2 ^ 0xff;
                  *pbVar16 = (byte)((ulong)((color & 0xff) * (uint)bVar2 + *pbVar16 * uVar12) *
                                    0x1010102 >> 0x20);
                  pbVar16[1] = (byte)((ulong)((color >> 8 & 0xff) * (uint)bVar2 +
                                             pbVar16[1] * uVar12) * 0x1010102 >> 0x20);
                  pbVar16[2] = (byte)((ulong)((uint)bVar2 * (color >> 0x10 & 0xff) +
                                             pbVar16[2] * uVar12) * 0x1010102 >> 0x20);
                  pbVar16 = pbVar16 + 3;
                  lVar10 = lVar10 + 1;
                } while (uVar4 - uVar9 != (int)lVar10);
              }
              uVar14 = uVar14 + 1;
              puVar15 = puVar15 + fontpixelsize;
            } while (uVar14 != uVar3);
          }
        }
      }
      uVar12 = uVar13;
      uVar11 = uVar11 + 1;
    } while (uVar11 != ((uint)sVar8 & 0x7fffffff));
  }
  operator_delete__(resized_font_bitmap);
  return;
}

Assistant:

void draw_text_c3(unsigned char* pixels, int w, int h, int stride, const char* text, int x, int y, int fontpixelsize, unsigned int color)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    unsigned char* resized_font_bitmap = new unsigned char[fontpixelsize * fontpixelsize * 2];

    const int n = strlen(text);

    int cursor_x = x;
    int cursor_y = y;
    for (int i = 0; i < n; i++)
    {
        char ch = text[i];

        if (ch == '\n')
        {
            // newline
            cursor_x = x;
            cursor_y += fontpixelsize * 2;
            continue;
        }

        if (ch == ' ')
        {
            cursor_x += fontpixelsize;
            continue;
        }

        if (isprint(ch) != 0)
        {
            const unsigned char* font_bitmap = mono_font_data[ch - '!'];

            // draw resized character
            resize_bilinear_font(font_bitmap, resized_font_bitmap, fontpixelsize);

            const int ystart = std::max(cursor_y, 0);
            const int yend = std::min(cursor_y + fontpixelsize * 2, h);
            const int xstart = std::max(cursor_x, 0);
            const int xend = std::min(cursor_x + fontpixelsize, w);

            for (int j = ystart; j < yend; j++)
            {
                const unsigned char* palpha = resized_font_bitmap + (j - cursor_y) * fontpixelsize + xstart - cursor_x;
                unsigned char* p = pixels + stride * j + xstart * 3;

                for (int k = xstart; k < xend; k++)
                {
                    unsigned char alpha = *palpha++;

                    p[0] = (p[0] * (255 - alpha) + pen_color[0] * alpha) / 255;
                    p[1] = (p[1] * (255 - alpha) + pen_color[1] * alpha) / 255;
                    p[2] = (p[2] * (255 - alpha) + pen_color[2] * alpha) / 255;
                    p += 3;
                }
            }

            cursor_x += fontpixelsize;
        }
    }

    delete[] resized_font_bitmap;
}